

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O1

char * utf8::append<char*>(uint32_t cp,char *result)

{
  undefined8 *puVar1;
  byte bVar2;
  char *pcVar3;
  
  if ((cp < 0x110000) && ((cp & 0xfffff800) != 0xd800)) {
    bVar2 = (byte)cp;
    if (cp < 0x80) {
      *result = bVar2;
      pcVar3 = result + 1;
    }
    else if (cp < 0x800) {
      *result = (byte)(cp >> 6) | 0xc0;
      result[1] = bVar2 & 0x3f | 0x80;
      pcVar3 = result + 2;
    }
    else if (cp < 0x10000) {
      *result = (byte)(cp >> 0xc) | 0xe0;
      result[1] = (byte)(cp >> 6) & 0x3f | 0x80;
      result[2] = bVar2 & 0x3f | 0x80;
      pcVar3 = result + 3;
    }
    else {
      *result = (byte)(cp >> 0x12) | 0xf0;
      result[1] = (byte)(cp >> 0xc) & 0x3f | 0x80;
      result[2] = (byte)(cp >> 6) & 0x3f | 0x80;
      result[3] = bVar2 & 0x3f | 0x80;
      pcVar3 = result + 4;
    }
    return pcVar3;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_0082d540;
  *(uint32_t *)(puVar1 + 1) = cp;
  __cxa_throw(puVar1,&invalid_code_point::typeinfo,std::exception::~exception);
}

Assistant:

octet_iterator append(uint32_t cp, octet_iterator result)
    {
        if (!utf8::internal::is_code_point_valid(cp))
            throw invalid_code_point(cp);

        if (cp < 0x80)                        // one octet
            *(result++) = static_cast<uint8_t>(cp);
        else if (cp < 0x800) {                // two octets
            *(result++) = static_cast<uint8_t>((cp >> 6)            | 0xc0);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else if (cp < 0x10000) {              // three octets
            *(result++) = static_cast<uint8_t>((cp >> 12)           | 0xe0);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else {                                // four octets
            *(result++) = static_cast<uint8_t>((cp >> 18)           | 0xf0);
            *(result++) = static_cast<uint8_t>(((cp >> 12) & 0x3f)  | 0x80);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        return result;
    }